

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::TexImage2DBufferCase::createTexture(TexImage2DBufferCase *this)

{
  ContextWrapper *this_00;
  TextureFormat *this_01;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  TransferFormat TVar6;
  int iVar7;
  uint rowPitch;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  deUint32 tex;
  deUint32 buf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  Vec4 colorB;
  Vec4 colorA;
  PixelBufferAccess local_50;
  
  this_01 = &(this->super_Texture2DSpecCase).m_texFormat;
  TVar6 = glu::getTransferFormat((this->super_Texture2DSpecCase).m_texFormat);
  iVar5 = tcu::TextureFormat::getPixelSize(this_01);
  iVar7 = this->m_skipPixels + (this->super_Texture2DSpecCase).m_width;
  if (0 < this->m_rowLength) {
    iVar7 = this->m_rowLength;
  }
  rowPitch = -this->m_alignment & (this->m_alignment + iVar7 * iVar5) - 1U;
  buf = 0;
  tex = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&data,(long)(int)((this->m_skipRows + (this->super_Texture2DSpecCase).m_height) *
                               rowPitch + this->m_offset));
  fVar1 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMin.m_data[0];
  fVar2 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMin.m_data[1];
  fVar3 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMin.m_data[2];
  fVar4 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMin.m_data[3];
  fVar8 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMax.m_data[0] - fVar1;
  fVar9 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMax.m_data[1] - fVar2;
  fVar10 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMax.m_data[2] - fVar3;
  fVar11 = (this->super_Texture2DSpecCase).m_texFormatInfo.valueMax.m_data[3] - fVar4;
  colorA.m_data[0] = fVar8 * 1.0 + fVar1;
  colorA.m_data[1] = fVar9 * 0.0 + fVar2;
  colorA.m_data[2] = fVar10 * 0.0 + fVar3;
  colorA.m_data[3] = fVar11 * 1.0 + fVar4;
  colorB.m_data[0] = fVar8 * 0.0 + fVar1;
  colorB.m_data[1] = fVar9 * 1.0 + fVar2;
  colorB.m_data[2] = fVar10 * 0.0 + fVar3;
  colorB.m_data[3] = fVar11 * 1.0 + fVar4;
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_50,this_01,(this->super_Texture2DSpecCase).m_width,
             (this->super_Texture2DSpecCase).m_height,1,rowPitch,0,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start +
             (long)this->m_offset + (long)(iVar5 * this->m_skipPixels) +
             (long)(int)(this->m_skipRows * rowPitch));
  tcu::fillWithGrid(&local_50,4,&colorA,&colorB);
  this_00 = &(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenBuffers(this_00,1,&buf);
  sglr::ContextWrapper::glBindBuffer(this_00,0x88ec,buf);
  sglr::ContextWrapper::glBufferData
            (this_00,0x88ec,
             (long)((int)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (int)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start),
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e4);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf2,this->m_rowLength);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf3,this->m_skipRows);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf4,this->m_skipPixels);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,this->m_alignment);
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  sglr::ContextWrapper::glTexImage2D
            (this_00,0xde1,0,*(int *)&(this->super_Texture2DSpecCase).field_0xd4,
             (this->super_Texture2DSpecCase).m_width,(this->super_Texture2DSpecCase).m_height,0,
             TVar6.format,TVar6.dataType,(void *)(long)this->m_offset);
  if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat		transferFmt		= glu::getTransferFormat(m_texFormat);
		int						pixelSize		= m_texFormat.getPixelSize();
		int						rowLength		= m_rowLength > 0 ? m_rowLength : m_width + m_skipPixels;
		int						rowPitch		= deAlign32(rowLength*pixelSize, m_alignment);
		int						height			= m_height + m_skipRows;
		deUint32				buf				= 0;
		deUint32				tex				= 0;
		vector<deUint8>			data;

		DE_ASSERT(m_numLevels == 1);

		// Fill data with grid.
		data.resize(rowPitch*height + m_offset);
		{
			Vec4	cScale		= m_texFormatInfo.valueMax-m_texFormatInfo.valueMin;
			Vec4	cBias		= m_texFormatInfo.valueMin;
			Vec4	colorA		= Vec4(1.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias;
			Vec4	colorB		= Vec4(0.0f, 1.0f, 0.0f, 1.0f)*cScale + cBias;

			tcu::fillWithGrid(tcu::PixelBufferAccess(m_texFormat, m_width, m_height, 1, rowPitch, 0, &data[0] + m_skipRows*rowPitch + m_skipPixels*pixelSize + m_offset), 4, colorA, colorB);
		}

		// Create buffer and upload.
		glGenBuffers(1, &buf);
		glBindBuffer(GL_PIXEL_UNPACK_BUFFER, buf);
		glBufferData(GL_PIXEL_UNPACK_BUFFER, (int)data.size(), &data[0], GL_STATIC_DRAW);

		glPixelStorei(GL_UNPACK_ROW_LENGTH,		m_rowLength);
		glPixelStorei(GL_UNPACK_SKIP_ROWS,		m_skipRows);
		glPixelStorei(GL_UNPACK_SKIP_PIXELS,	m_skipPixels);
		glPixelStorei(GL_UNPACK_ALIGNMENT,		m_alignment);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glTexImage2D(GL_TEXTURE_2D, 0, m_internalFormat, m_width, m_height, 0, transferFmt.format, transferFmt.dataType, (const void*)(deUintptr)m_offset);
	}